

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

bool __thiscall
QPDF::pipeStreamData
          (QPDF *this,QPDFObjGen og,qpdf_offset_t offset,size_t length,QPDFObjectHandle *stream_dict
          ,bool is_root_metadata,Pipeline *pipeline,bool suppress_warnings,bool will_retry)

{
  QPDFObjectHandle *length_00;
  size_t offset_00;
  bool bVar1;
  pointer pMVar2;
  QPDFObjectHandle local_88;
  QPDFObjGen local_78;
  shared_ptr<InputSource> local_70;
  shared_ptr<QPDF::EncryptionParameters> local_60;
  byte local_4b;
  byte local_4a;
  byte local_49;
  bool will_retry_local;
  bool suppress_warnings_local;
  QPDFObjectHandle *pQStack_48;
  bool is_root_metadata_local;
  QPDFObjectHandle *stream_dict_local;
  size_t length_local;
  qpdf_offset_t offset_local;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  local_4a = suppress_warnings;
  local_4b = will_retry;
  local_49 = is_root_metadata;
  pQStack_48 = stream_dict;
  stream_dict_local = (QPDFObjectHandle *)length;
  length_local = offset;
  offset_local = (qpdf_offset_t)this;
  this_local = (QPDF *)og;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::shared_ptr<QPDF::EncryptionParameters>::shared_ptr(&local_60,&pMVar2->encp);
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::shared_ptr<InputSource>::shared_ptr(&local_70,&pMVar2->file);
  offset_00 = length_local;
  length_00 = stream_dict_local;
  local_78 = (QPDFObjGen)this_local;
  QPDFObjectHandle::QPDFObjectHandle(&local_88,stream_dict);
  bVar1 = pipeStreamData(&local_60,&local_70,this,local_78,offset_00,(size_t)length_00,&local_88,
                         (bool)(local_49 & 1),pipeline,(bool)(local_4a & 1),(bool)(local_4b & 1));
  QPDFObjectHandle::~QPDFObjectHandle(&local_88);
  std::shared_ptr<InputSource>::~shared_ptr(&local_70);
  std::shared_ptr<QPDF::EncryptionParameters>::~shared_ptr(&local_60);
  return bVar1;
}

Assistant:

bool
QPDF::pipeStreamData(
    QPDFObjGen og,
    qpdf_offset_t offset,
    size_t length,
    QPDFObjectHandle stream_dict,
    bool is_root_metadata,
    Pipeline* pipeline,
    bool suppress_warnings,
    bool will_retry)
{
    return pipeStreamData(
        m->encp,
        m->file,
        *this,
        og,
        offset,
        length,
        stream_dict,
        is_root_metadata,
        pipeline,
        suppress_warnings,
        will_retry);
}